

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O2

Accel * __thiscall
embree::BVH4Factory::BVH4Quad4iMB
          (BVH4Factory *this,Scene *scene,BuildVariant bvariant,IntersectVariant ivariant)

{
  bool bVar1;
  BVHN<4> *this_00;
  Builder *builder;
  AccelInstance *this_01;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  Intersectors intersectors;
  
  this_00 = (BVHN<4> *)BVHN<4>::operator_new(0x240);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&QuadMi<4>::type,scene);
  BVH4Quad4iMBIntersectors(&intersectors,this,this_00,ivariant);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)&(scene->super_AccelN).field_0x188 + 0x150),"default");
  if (bVar1) {
    if (bvariant != STATIC) {
      builder = (Builder *)0x0;
      goto LAB_0040c9f5;
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&(scene->super_AccelN).field_0x188 + 0x150),"sah");
    if (!bVar1) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::operator+(&local_180,"unknown builder ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)&(scene->super_AccelN).field_0x188 + 0x150));
      std::operator+(&local_160,&local_180," for BVH4<Quad4iMB>");
      *puVar2 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar2 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar2 + 2),(string *)&local_160);
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  builder = (*this->BVH4Quad4iMBSceneBuilderSAH)(this_00,scene,0);
LAB_0040c9f5:
  this_01 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_01,(AccelData *)this_00,builder,&intersectors);
  return &this_01->super_Accel;
}

Assistant:

Accel* BVH4Factory::BVH4Quad4iMB(Scene* scene, BuildVariant bvariant, IntersectVariant ivariant)
  {
    BVH4* accel = new BVH4(Quad4i::type,scene);
    Accel::Intersectors intersectors = BVH4Quad4iMBIntersectors(accel,ivariant);

    Builder* builder = nullptr;
    if (scene->device->quad_builder_mb == "default") {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH4Quad4iMBSceneBuilderSAH(accel,scene,0); break;
      case BuildVariant::DYNAMIC     : assert(false); break; // FIXME: implement
      case BuildVariant::HIGH_QUALITY: assert(false); break;
      }
    }
    else if (scene->device->quad_builder_mb == "sah") builder = BVH4Quad4iMBSceneBuilderSAH(accel,scene,0);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->quad_builder_mb+" for BVH4<Quad4iMB>");

    return new AccelInstance(accel,builder,intersectors);
  }